

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
          (IfcDimensionCurveDirectedCallout *this)

{
  *(undefined ***)&(this->super_IfcDraughtingCallout).field_0x58 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcDimensionCurveDirectedCallout";
  IfcDraughtingCallout::IfcDraughtingCallout
            (&this->super_IfcDraughtingCallout,&PTR_construction_vtable_24__007612e0);
  (this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x761228;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x58 = 0x7612c8;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x761250;
  *(undefined8 *)
   &(this->super_IfcDraughtingCallout).super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x761278;
  *(undefined8 *)&(this->super_IfcDraughtingCallout).field_0x48 = 0x7612a0;
  return;
}

Assistant:

IfcDimensionCurveDirectedCallout() : Object("IfcDimensionCurveDirectedCallout") {}